

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

int prf_model_traverse_df(prf_model_t *model,prf_cb_t callback)

{
  int iVar1;
  int iVar2;
  prf_state_t *state;
  void *pvVar3;
  void *pvVar4;
  undefined8 *id;
  int *id_00;
  prf_nodeinfo_t *ppVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  prf_node_t *ppVar10;
  int *local_58;
  long lVar9;
  
  state = prf_state_create();
  state->model = model;
  pvVar3 = prf_array_init(8,8);
  iVar2 = 1;
  pvVar4 = prf_array_init(1,8);
  pvVar4 = prf_array_append_ptr(pvVar4,model->header);
  id = (undefined8 *)prf_array_append_ptr(pvVar3,pvVar4);
  pvVar3 = prf_array_init(4,4);
  uVar6 = 0;
  id_00 = (int *)prf_array_append_int(pvVar3,0);
  pvVar3 = prf_array_init(4,4);
  iVar1 = prf_array_count((void *)*id);
  local_58 = (int *)prf_array_append_int(pvVar3,iVar1);
LAB_00102515:
  do {
    if (*local_58 <= *id_00) {
LAB_0010276c:
      prf_state_destroy(state);
      prf_array_free(id);
      prf_array_free(pvVar4);
      prf_array_free(id_00);
      prf_array_free(local_58);
      return iVar2;
    }
    uVar6 = (ulong)(int)uVar6;
    ppVar10 = *(prf_node_t **)(id[uVar6] + (long)id_00[uVar6] * 8);
    ppVar5 = prf_nodeinfo_get(ppVar10->opcode);
    if ((ppVar5 != (prf_nodeinfo_t *)0x0) &&
       (ppVar5->entry_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0)) {
      (*ppVar5->entry_f)(ppVar10,state);
    }
    lVar7 = uVar6 << 0x20;
    while (ppVar10->children != (prf_node_t **)0x0) {
      id = (undefined8 *)prf_array_append_ptr(id,ppVar10->children);
      id_00 = (int *)prf_array_append_int(id_00,0);
      iVar2 = prf_array_count((void *)id[uVar6 + 1]);
      local_58 = (int *)prf_array_append_int(local_58,iVar2);
      prf_state_push(state);
      state->physical_level = state->physical_level + 1;
      ppVar10 = *(prf_node_t **)(id[uVar6 + 1] + (long)id_00[uVar6 + 1] * 8);
      ppVar5 = prf_nodeinfo_get(ppVar10->opcode);
      if (ppVar5->entry_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0) {
        (*ppVar5->entry_f)(ppVar10,state);
      }
      lVar7 = lVar7 + 0x100000000;
      uVar6 = uVar6 + 1;
    }
    state->node = ppVar10;
    iVar2 = (*callback.func)(state,callback.data);
    lVar8 = lVar7 >> 0x1e;
    lVar9 = lVar7 >> 0x20;
    if (iVar2 != 3) {
      if (iVar2 == 0) goto LAB_0010276c;
      iVar1 = *(int *)((long)id_00 + lVar8) + 1;
      *(int *)((long)id_00 + lVar8) = iVar1;
      if ((0 < (long)uVar6) && (local_58[lVar9] <= iVar1)) {
        iVar2 = prf_array_count(id);
        id = (undefined8 *)prf_array_set_count(id,iVar2 + -1);
        iVar2 = prf_array_count(id_00);
        id_00 = (int *)prf_array_set_count(id_00,iVar2 + -1);
        iVar2 = prf_array_count(local_58);
        local_58 = (int *)prf_array_set_count(local_58,iVar2 + -1);
        prf_state_pop(state);
        uVar6 = (ulong)((int)uVar6 - 1);
        state->physical_level = state->physical_level - 1;
        ppVar10 = *(prf_node_t **)(id[uVar6] + (long)id_00[uVar6] * 8);
        prf_nodeinfo_get(ppVar10->opcode);
        state->node = ppVar10;
        iVar2 = (*callback.func)(state,callback.data);
        if (iVar2 == 0) {
          iVar2 = 0;
          goto LAB_0010276c;
        }
        id_00[uVar6] = id_00[uVar6] + 1;
      }
      goto LAB_00102515;
    }
    ppVar5 = prf_nodeinfo_get(**(uint16_t **)
                                (*(long *)((long)id + (lVar7 >> 0x1d)) +
                                (long)*(int *)((long)id_00 + lVar8) * 8));
    do {
      if (ppVar5->exit_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0) {
        (*ppVar5->exit_f)(*(prf_node_t **)(id[lVar9] + (long)id_00[lVar9] * 8),state);
      }
      iVar2 = id_00[lVar9];
      id_00[lVar9] = iVar2 + 1;
      ppVar5 = prf_nodeinfo_get(**(uint16_t **)(id[lVar9] + 8 + (long)iVar2 * 8));
      if (ppVar5->entry_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0) {
        (*ppVar5->entry_f)(*(prf_node_t **)(id[lVar9] + (long)id_00[lVar9] * 8),state);
      }
    } while ((ppVar5->flags & 2) == 0);
    iVar2 = 3;
  } while( true );
}

Assistant:

int
prf_model_traverse_df( /* depth-first traversal */
    prf_model_t * model,
    prf_cb_t callback )
{
    prf_node_t *** stack, * node;
    prf_node_t ** array;
    int * child, * limit, level, traverse;
    prf_state_t * state;
    prf_nodeinfo_t * info;
    /* only losers recurse ;) */

    assert( model != NULL );
    assert( model->header != NULL );

    state = prf_state_create();
    state->model = model;
    stack = (prf_node_t ***)prf_array_init( 8, sizeof( prf_node_t ** ) );
    assert( stack != NULL );
    array = (prf_node_t **)prf_array_init( 1, sizeof( prf_node_t * ) );
    assert( array != NULL );
    array = (prf_node_t **)prf_array_append_ptr( array, model->header );
    stack = (prf_node_t ***)prf_array_append_ptr( stack, array );
    child = (int *)prf_array_init( 4, sizeof( int ) );
    assert( child != NULL );
    child = (int *)prf_array_append_int( child, 0 );
    limit = (int *)prf_array_init( 4, sizeof( int ) );
    assert( limit != NULL );
    limit = (int *)prf_array_append_int( limit, prf_array_count(stack[0]));
    traverse = PRF_TRAV_CONTINUE;

    level = 0;
    while ( child[0] < limit[0] ) {
        node = stack[level][child[level]];
        info = prf_nodeinfo_get( node->opcode );

        if ( (info != NULL) && (info->entry_f != NULL) )
            (*info->entry_f)(node, state);

        while ( node->children != NULL ) {
            stack = (prf_node_t ***)prf_array_append_ptr(stack,node->children);
            child = (int *)prf_array_append_int( child, 0 );
            limit = (int *)prf_array_append_int(limit, prf_array_count(stack[level+1]));
            prf_state_push( state );
            level++;
            state->physical_level++;
            node = stack[level][child[level]];
            info = prf_nodeinfo_get( node->opcode );
            if ( info->entry_f != NULL )
                (*info->entry_f)(node, state);
        }

        state->node = node;
        traverse = prf_cb_call( callback, state );

        if ( traverse == PRF_TRAV_EXIT )
            break;

        if ( traverse == PRF_TRAV_POP ) {
            prf_nodeinfo_t * info;
            info = prf_nodeinfo_get( stack[level][child[level]]->opcode );
            do {
                if ( info->exit_f != NULL )
                    (*(info->exit_f))( stack[level][child[level]], state );
                
                child[level]++;
                info = prf_nodeinfo_get( stack[level][child[level]]->opcode );
                if ( info->entry_f != NULL )
                    (*(info->entry_f))( stack[level][child[level]], state );
            } while ( (info->flags & PRF_POP_NODE) == 0 );
            continue;
        }

        child[level]++;

        if ( (level > 0) && (child[level] >= limit[level]) ) {
            stack = (prf_node_t ***)prf_array_set_count( stack, prf_array_count( stack ) - 1 );
            child = (int *)prf_array_set_count( child, prf_array_count( child ) - 1 );
            limit = (int *)prf_array_set_count( limit, prf_array_count( limit ) - 1 );
            prf_state_pop( state );
            level--;
            state->physical_level--;

            node = stack[level][child[level]];
            info = prf_nodeinfo_get( node->opcode );

            state->node = node;
            traverse = prf_cb_call( callback, state );

            if ( traverse == PRF_TRAV_EXIT )
                break;

            child[level]++;
        }
    }

    prf_state_destroy( state );
    prf_array_free( stack );
    prf_array_free( array );
    prf_array_free( child );
    prf_array_free( limit );
    return traverse;
}